

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O0

bool __thiscall EmmyFacade::PipeListen(EmmyFacade *this,lua_State *L,string *name,string *err)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  element_type *this_01;
  undefined1 local_48 [7];
  bool suc;
  shared_ptr<PipelineServerTransporter> p;
  string *err_local;
  string *name_local;
  lua_State *L_local;
  EmmyFacade *this_local;
  
  Destroy(this);
  this_00 = &p.super___shared_ptr<PipelineServerTransporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  EmmyDebuggerManager::AddDebugger
            ((EmmyDebuggerManager *)this_00,(lua_State *)&this->_emmyDebuggerManager);
  std::shared_ptr<Debugger>::~shared_ptr((shared_ptr<Debugger> *)this_00);
  SetReadyHook(this,L);
  std::make_shared<PipelineServerTransporter>();
  std::shared_ptr<Transporter>::operator=
            (&this->transporter,(shared_ptr<PipelineServerTransporter> *)local_48);
  this_01 = std::
            __shared_ptr_access<PipelineServerTransporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<PipelineServerTransporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_48);
  iVar1 = PipelineServerTransporter::pipe(this_01,(int *)name);
  std::shared_ptr<PipelineServerTransporter>::~shared_ptr
            ((shared_ptr<PipelineServerTransporter> *)local_48);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool EmmyFacade::PipeListen(lua_State *L, const std::string &name, std::string &err) {
	Destroy();

	_emmyDebuggerManager.AddDebugger(L);

	SetReadyHook(L);

	const auto p = std::make_shared<PipelineServerTransporter>();
	transporter = p;
	// p->SetHandler(shared_from_this());
	const auto suc = p->pipe(name, err);
	return suc;
}